

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int diag(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [8];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char local_4d;
  int local_4c;
  char c;
  char *pcStack_48;
  int i;
  char *line;
  char *mesg;
  va_list args;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  mesg._4_4_ = 0x30;
  mesg._0_4_ = 8;
  if (fmt != (char *)0x0) {
    local_100 = in_RSI;
    local_f8 = in_RDX;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    pcStack_48 = vstrdupf(fmt,(__va_list_tag *)&mesg);
    local_4c = 0;
    line = pcStack_48;
    while (*pcStack_48 != '\0') {
      local_4d = line[local_4c];
      if ((local_4d == '\0') || (local_4d == '\n')) {
        line[local_4c] = '\0';
        printf("# %s\n",pcStack_48);
        if (local_4d == '\0') break;
        line[local_4c] = local_4d;
        pcStack_48 = line + (long)local_4c + 1;
      }
      local_4c = local_4c + 1;
    }
    free(line);
  }
  return 0;
}

Assistant:

int
diag (const char *fmt, ...) {
    va_list args;
    char *mesg, *line;
    int i;
    va_start(args, fmt);
    if (!fmt) {
        va_end(args);
        return 0;
    }
    mesg = vstrdupf(fmt, args);
    line = mesg;
    for (i = 0; *line; i++) {
        char c = mesg[i];
        if (!c || c == '\n') {
            mesg[i] = '\0';
            printf("# %s\n", line);
            if (!c)
                break;
            mesg[i] = c;
            line = mesg + i + 1;
        }
    }
    free(mesg);
    va_end(args);
    return 0;
}